

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
 __thiscall
unodb::detail::olc_impl_helpers::
add_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_256<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_impl_helpers *this,
          olc_inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode,
          byte key_byte,basic_art_key<unsigned_long> k,value_view v,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_instance,
          tree_depth<unodb::detail::basic_art_key<unsigned_long>_> depth,
          read_critical_section *node_critical_section,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          *node_in_parent,read_critical_section *parent_critical_section,
          olc_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>_> *cached_leaf)

{
  uintptr_t *puVar1;
  uintptr_t uVar2;
  olc_impl_helpers children_count_;
  uintptr_t *puVar3;
  uintptr_t uVar4;
  long *plVar5;
  bool bVar6;
  _Storage<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true>
  _Var7;
  undefined7 in_register_00000011;
  undefined8 unaff_RBX;
  ulong uVar8;
  optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  oVar9;
  undefined4 in_stack_00000014;
  write_guard local_38;
  write_guard write_unlock_on_exit;
  
  uVar8 = CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  if (*(long *)(this + ((ulong)inode & 0xffffffff) * 8 + 0x28) == 0) {
    plVar5 = (long *)CONCAT44(in_stack_00000014,depth.value);
    create_leaf_if_needed<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>
              ((detail *)parent_critical_section,
               (olc_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>_> *)
               CONCAT71(in_register_00000011,key_byte),k,v,
               (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
               v._M_extent._M_extent_value._M_extent_value);
    children_count_ = this[0x20];
    bVar6 = optimistic_lock::try_upgrade_to_write_lock
                      ((optimistic_lock *)*plVar5,(version_type)plVar5[1]);
    local_38.lock = (optimistic_lock *)0x0;
    if (bVar6) {
      local_38.lock = (optimistic_lock *)*plVar5;
    }
    *plVar5 = 0;
    if (local_38.lock != (optimistic_lock *)0x0) {
      puVar3 = (uintptr_t *)(node_in_parent->value)._M_i.tagged_ptr;
      uVar4 = node_in_parent[1].value._M_i.tagged_ptr;
      if ((long)puVar3[1] < 1) {
        __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
      }
      LOCK();
      puVar1 = puVar3 + 1;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if (uVar4 == *puVar3) {
        if (0 < (long)uVar2) {
          (node_in_parent->value)._M_i.tagged_ptr = 0;
          basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
          ::add_to_nonfull((basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                            *)this,(db_leaf_unique_ptr *)parent_critical_section,db_instance._0_4_,
                           (uint8_t)children_count_);
          optimistic_lock::write_guard::~write_guard(&local_38);
          _Var7._M_value =
               (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                *)0x0;
          goto LAB_001a933d;
        }
LAB_001a9388:
        __assert_fail("old_value > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
      }
      if ((long)uVar2 < 1) goto LAB_001a9388;
      (node_in_parent->value)._M_i.tagged_ptr = 0;
    }
    optimistic_lock::write_guard::~write_guard(&local_38);
    _Var7._M_value =
         (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)0x0;
    uVar8 = 0;
  }
  else {
    _Var7._M_value =
         (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
         (this + ((ulong)inode & 0xffffffff) * 8 + 0x28);
  }
LAB_001a933d:
  oVar9.
  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  ._M_payload.
  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ._8_8_ = uVar8 & 0xffffffff;
  oVar9.
  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  ._M_payload.
  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ._M_payload._M_value = _Var7._M_value;
  return (optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
          )oVar9.
           super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
           ._M_payload.
           super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ;
}

Assistant:

[[nodiscard]] std::optional<in_critical_section<olc_node_ptr>*>
olc_impl_helpers::add_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k, value_view v,
    olc_db<Key, Value>& db_instance, tree_depth<basic_art_key<Key>> depth,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    optimistic_lock::read_critical_section& parent_critical_section,
    olc_db_leaf_unique_ptr<Key, Value>& cached_leaf) {
  auto* const child_in_parent = inode.find_child(key_byte).second;

  if (child_in_parent == nullptr) {
    create_leaf_if_needed(cached_leaf, k, v, db_instance);

    const auto children_count = inode.get_children_count();

    if constexpr (!std::is_same_v<INode, olc_inode_256<Key, Value>>) {
      if (UNODB_DETAIL_UNLIKELY(children_count == INode::capacity)) {
        auto larger_node{
            INode::larger_derived_type::create(db_instance, inode)};
        {
          const optimistic_lock::write_guard write_unlock_on_exit{
              std::move(parent_critical_section)};
          if (UNODB_DETAIL_UNLIKELY(write_unlock_on_exit.must_restart()))
            return {};  // LCOV_EXCL_LINE

          optimistic_lock::write_guard node_write_guard{
              std::move(node_critical_section)};
          if (UNODB_DETAIL_UNLIKELY(node_write_guard.must_restart())) return {};

          larger_node->init(db_instance, inode, node_write_guard,
                            std::move(cached_leaf), depth);
          *node_in_parent = detail::olc_node_ptr{
              larger_node.release(), INode::larger_derived_type::type};

          UNODB_DETAIL_ASSERT(!node_write_guard.active());
        }

#ifdef UNODB_DETAIL_WITH_STATS
        db_instance
            .template account_growing_inode<INode::larger_derived_type::type>();
#endif  // UNODB_DETAIL_WITH_STATS

        return child_in_parent;
      }
    }

    const optimistic_lock::write_guard write_unlock_on_exit{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(write_unlock_on_exit.must_restart())) return {};

    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    inode.add_to_nonfull(std::move(cached_leaf), depth, children_count);
  }

  return child_in_parent;
}